

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O2

void __thiscall
google::protobuf::util::
StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::StatusOr
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Status *status)

{
  undefined1 local_50 [40];
  StringPiece local_28;
  
  Status::Status(&this->status_);
  (this->value_)._M_dataplus._M_p = (pointer)&(this->value_).field_2;
  (this->value_)._M_string_length = 0;
  (this->value_).field_2._M_local_buf[0] = '\0';
  if (status->error_code_ == OK) {
    StringPiece::StringPiece(&local_28,"Status::OK is not a valid argument.");
    Status::Status((Status *)local_50,INTERNAL,local_28);
    Status::operator=(&this->status_,(Status *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  else {
    Status::operator=(&this->status_,status);
  }
  return;
}

Assistant:

inline StatusOr<T>::StatusOr(const Status& status) {
  if (status.ok()) {
    status_ = Status(error::INTERNAL, "Status::OK is not a valid argument.");
  } else {
    status_ = status;
  }
}